

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O0

void __thiscall helics::DependencyInfo::DependencyInfo(DependencyInfo *this)

{
  long in_RDI;
  TimeData *unaff_retaddr;
  
  TimeData::TimeData(unaff_retaddr);
  memset((GlobalFederateId *)(in_RDI + 0x48),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 0x48));
  *(undefined1 *)(in_RDI + 0x4c) = 0;
  *(undefined1 *)(in_RDI + 0x4d) = 0;
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  *(undefined1 *)(in_RDI + 0x4f) = 0;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  *(undefined1 *)(in_RDI + 0x51) = 0;
  *(undefined1 *)(in_RDI + 0x52) = 0;
  *(undefined1 *)(in_RDI + 0x53) = 0;
  return;
}

Assistant:

DependencyInfo() = default;